

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.h
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDD::LoadableGetStateBlock_x
          (ChNodeFEAxyzDD *this,int block_offset,ChState *mDD)

{
  double *pdVar1;
  Index index;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((-1 < block_offset) &&
     ((long)block_offset <=
      (mDD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)) {
    pdVar1 = (mDD->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             block_offset;
    uVar2 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
      uVar2 = uVar3;
    }
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        pdVar1[uVar3] =
             *(double *)
              (&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x20 +
              uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    if (uVar2 < 3) {
      do {
        pdVar1[uVar2] =
             *(double *)
              (&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x20 +
              uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (uVar2 != 3);
    }
    uVar2 = (ulong)(uint)block_offset;
    if ((long)(uVar2 + 3) <=
        (mDD->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
      pdVar1 = (mDD->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               uVar2 + 3;
      uVar3 = 3;
      if ((((ulong)pdVar1 & 7) == 0) &&
         (uVar4 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
        uVar3 = uVar4;
      }
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          pdVar1[uVar4] = *(double *)((long)(&(this->super_ChNodeFEAxyzD).D_dt + -1) + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      if (uVar3 < 3) {
        do {
          pdVar1[uVar3] = *(double *)((long)(&(this->super_ChNodeFEAxyzD).D_dt + -1) + uVar3 * 8);
          uVar3 = uVar3 + 1;
        } while (uVar3 != 3);
      }
      if ((long)(uVar2 + 6) <=
          (mDD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
        pdVar1 = (mDD->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 uVar2 + 6;
        uVar2 = 3;
        if ((((ulong)pdVar1 & 7) == 0) &&
           (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
          uVar2 = uVar3;
        }
        if (uVar2 != 0) {
          uVar3 = 0;
          do {
            pdVar1[uVar3] = *(double *)((long)(&this->DD_dt + -1) + uVar3 * 8);
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
        if (uVar2 < 3) {
          do {
            pdVar1[uVar2] = *(double *)((long)(&this->DD_dt + -1) + uVar2 * 8);
            uVar2 = uVar2 + 1;
          } while (uVar2 != 3);
        }
        return;
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

virtual void LoadableGetStateBlock_x(int block_offset, ChState& mDD) override {
        mDD.segment(block_offset + 0, 3) = pos.eigen();
        mDD.segment(block_offset + 3, 3) = D.eigen();
        mDD.segment(block_offset + 6, 3) = DD.eigen();
    }